

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,TextureCubeView *src,float *texCoord,ReferenceParams *params)

{
  undefined1 local_90 [8];
  Vec4 rq;
  Vec4 tq;
  Vec4 sq;
  TextureCubeView view;
  ReferenceParams *params_local;
  float *texCoord_local;
  TextureCubeView *src_local;
  SurfaceAccess *dst_local;
  
  getSubView((TextureCubeView *)(sq.m_data + 2),src,params->baseLevel,params->maxLevel);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(tq.m_data + 2),*texCoord,texCoord[3],texCoord[6],texCoord[9]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(rq.m_data + 2),texCoord[1],texCoord[4],texCoord[7],texCoord[10]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)local_90,texCoord[2],texCoord[5],texCoord[8],texCoord[0xb]);
  sampleTextureCube(dst,(TextureCubeView *)(sq.m_data + 2),(Vec4 *)(tq.m_data + 2),
                    (Vec4 *)(rq.m_data + 2),(Vec4 *)local_90,params);
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::TextureCubeView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::TextureCubeView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4				tq		= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4				rq		= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	return sampleTextureCube(dst, view, sq, tq, rq, params);
}